

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SigmoidParameter::MergeFrom(SigmoidParameter *this,Message *from)

{
  LogMessage *other;
  SigmoidParameter *from_00;
  SigmoidParameter *source;
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *from_local;
  SigmoidParameter *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = &this->super_Message;
  if ((SigmoidParameter *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x90a3);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&source + 3),other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = google::protobuf::internal::DynamicCastToGenerated<caffe::SigmoidParameter_const>
                      (local_18);
  if (from_00 == (SigmoidParameter *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(local_18,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void SigmoidParameter::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:caffe.SigmoidParameter)
  GOOGLE_DCHECK_NE(&from, this);
  const SigmoidParameter* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const SigmoidParameter>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:caffe.SigmoidParameter)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:caffe.SigmoidParameter)
    MergeFrom(*source);
  }
}